

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlCopyCharMultiByte(xmlChar *out,int val)

{
  int local_2c;
  int bits;
  xmlChar *savedout;
  byte *pbStack_18;
  int val_local;
  xmlChar *out_local;
  
  if ((out == (xmlChar *)0x0) || (val < 0)) {
    out_local._4_4_ = 0;
  }
  else if (val < 0x80) {
    *out = (xmlChar)val;
    out_local._4_4_ = 1;
  }
  else {
    if (val < 0x800) {
      *out = (byte)(val >> 6) | 0xc0;
      local_2c = 0;
    }
    else if (val < 0x10000) {
      *out = (byte)(val >> 0xc) | 0xe0;
      local_2c = 6;
    }
    else {
      if (0x10ffff < val) {
        xmlErrEncodingInt((xmlParserCtxtPtr)0x0,XML_ERR_INVALID_CHAR,
                          "Internal error, xmlCopyCharMultiByte 0x%X out of bound\n",val);
        return 0;
      }
      *out = (byte)(val >> 0x12) | 0xf0;
      local_2c = 0xc;
    }
    pbStack_18 = out + 1;
    for (; -1 < local_2c; local_2c = local_2c + -6) {
      *pbStack_18 = (byte)(val >> ((byte)local_2c & 0x1f)) & 0x3f | 0x80;
      pbStack_18 = pbStack_18 + 1;
    }
    out_local._4_4_ = (int)pbStack_18 - (int)out;
  }
  return out_local._4_4_;
}

Assistant:

int
xmlCopyCharMultiByte(xmlChar *out, int val) {
    if ((out == NULL) || (val < 0)) return(0);
    /*
     * We are supposed to handle UTF8, check it's valid
     * From rfc2044: encoding of the Unicode values on UTF-8:
     *
     * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
     * 0000 0000-0000 007F   0xxxxxxx
     * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
     * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
     */
    if  (val >= 0x80) {
	xmlChar *savedout = out;
	int bits;
	if (val <   0x800) { *out++= (val >>  6) | 0xC0;  bits=  0; }
	else if (val < 0x10000) { *out++= (val >> 12) | 0xE0;  bits=  6;}
	else if (val < 0x110000)  { *out++= (val >> 18) | 0xF0;  bits=  12; }
	else {
	    xmlErrEncodingInt(NULL, XML_ERR_INVALID_CHAR,
		    "Internal error, xmlCopyCharMultiByte 0x%X out of bound\n",
			      val);
	    return(0);
	}
	for ( ; bits >= 0; bits-= 6)
	    *out++= ((val >> bits) & 0x3F) | 0x80 ;
	return (out - savedout);
    }
    *out = val;
    return 1;
}